

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O2

void load_16bit_7rows_avx2(int16_t *src,ptrdiff_t stride,__m256i *dst)

{
  longlong *plVar1;
  longlong lVar2;
  longlong lVar3;
  longlong lVar4;
  
  lVar2 = *(longlong *)(src + 4);
  lVar3 = *(longlong *)(src + 8);
  lVar4 = *(longlong *)(src + 0xc);
  (*dst)[0] = *(longlong *)src;
  (*dst)[1] = lVar2;
  (*dst)[2] = lVar3;
  (*dst)[3] = lVar4;
  plVar1 = (longlong *)(src + stride);
  lVar2 = plVar1[1];
  lVar3 = plVar1[2];
  lVar4 = plVar1[3];
  dst[1][0] = *plVar1;
  dst[1][1] = lVar2;
  dst[1][2] = lVar3;
  dst[1][3] = lVar4;
  plVar1 = (longlong *)(src + stride * 2);
  lVar2 = plVar1[1];
  lVar3 = plVar1[2];
  lVar4 = plVar1[3];
  dst[2][0] = *plVar1;
  dst[2][1] = lVar2;
  dst[2][2] = lVar3;
  dst[2][3] = lVar4;
  plVar1 = (longlong *)(src + stride * 3);
  lVar2 = plVar1[1];
  lVar3 = plVar1[2];
  lVar4 = plVar1[3];
  dst[3][0] = *plVar1;
  dst[3][1] = lVar2;
  dst[3][2] = lVar3;
  dst[3][3] = lVar4;
  plVar1 = (longlong *)(src + stride * 4);
  lVar2 = plVar1[1];
  lVar3 = plVar1[2];
  lVar4 = plVar1[3];
  dst[4][0] = *plVar1;
  dst[4][1] = lVar2;
  dst[4][2] = lVar3;
  dst[4][3] = lVar4;
  plVar1 = (longlong *)(src + stride * 5);
  lVar2 = plVar1[1];
  lVar3 = plVar1[2];
  lVar4 = plVar1[3];
  dst[5][0] = *plVar1;
  dst[5][1] = lVar2;
  dst[5][2] = lVar3;
  dst[5][3] = lVar4;
  plVar1 = (longlong *)(src + stride * 6);
  lVar2 = plVar1[1];
  lVar3 = plVar1[2];
  lVar4 = plVar1[3];
  dst[6][0] = *plVar1;
  dst[6][1] = lVar2;
  dst[6][2] = lVar3;
  dst[6][3] = lVar4;
  return;
}

Assistant:

static inline void load_16bit_7rows_avx2(const int16_t *const src,
                                         const ptrdiff_t stride,
                                         __m256i dst[7]) {
  dst[0] = _mm256_loadu_si256((__m256i *)(src + 0 * stride));
  dst[1] = _mm256_loadu_si256((__m256i *)(src + 1 * stride));
  dst[2] = _mm256_loadu_si256((__m256i *)(src + 2 * stride));
  dst[3] = _mm256_loadu_si256((__m256i *)(src + 3 * stride));
  dst[4] = _mm256_loadu_si256((__m256i *)(src + 4 * stride));
  dst[5] = _mm256_loadu_si256((__m256i *)(src + 5 * stride));
  dst[6] = _mm256_loadu_si256((__m256i *)(src + 6 * stride));
}